

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O2

void __thiscall
Ratio::Ratio(Ratio *this,vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *e,
            vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *f)

{
  double dVar1;
  
  dVar1 = geoAvg(e);
  this->eLength = dVar1;
  dVar1 = geoAvg(f);
  this->fLength = dVar1;
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector(&this->eEdges,e);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector(&this->fEdges,f);
  return;
}

Assistant:

Ratio::Ratio(vector<PhyloTreeEdge>& e, vector<PhyloTreeEdge>& f) :
        eEdges(e), fEdges(f), eLength(geoAvg(e)), fLength(geoAvg(f)) {
}